

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudio_Release(FAudio *audio)

{
  uint32_t uVar1;
  
  uVar1 = audio->refcount - 1;
  audio->refcount = uVar1;
  if (uVar1 == 0) {
    FAudio_OPERATIONSET_ClearAll(audio);
    audio->active = '\0';
    FAudio_OPERATIONSET_CommitAll(audio);
    FAudio_OPERATIONSET_Execute(audio);
    (*audio->pFree)(audio->decodeCache);
    (*audio->pFree)(audio->resampleCache);
    (*audio->pFree)(audio->effectChainCache);
    FAudio_PlatformDestroyMutex(audio->sourceLock);
    FAudio_PlatformDestroyMutex(audio->submixLock);
    FAudio_PlatformDestroyMutex(audio->callbackLock);
    FAudio_PlatformDestroyMutex(audio->operationLock);
    (*audio->pFree)(audio);
    FAudio_PlatformRelease();
  }
  return uVar1;
}

Assistant:

uint32_t FAudio_Release(FAudio *audio)
{
	uint32_t refcount;
	LOG_API_ENTER(audio)
	audio->refcount -= 1;
	refcount = audio->refcount;
	if (audio->refcount == 0)
	{
		FAudio_OPERATIONSET_ClearAll(audio);
		FAudio_StopEngine(audio);
		audio->pFree(audio->decodeCache);
		audio->pFree(audio->resampleCache);
		audio->pFree(audio->effectChainCache);
		LOG_MUTEX_DESTROY(audio, audio->sourceLock)
		FAudio_PlatformDestroyMutex(audio->sourceLock);
		LOG_MUTEX_DESTROY(audio, audio->submixLock)
		FAudio_PlatformDestroyMutex(audio->submixLock);
		LOG_MUTEX_DESTROY(audio, audio->callbackLock)
		FAudio_PlatformDestroyMutex(audio->callbackLock);
		LOG_MUTEX_DESTROY(audio, audio->operationLock)
		FAudio_PlatformDestroyMutex(audio->operationLock);
		audio->pFree(audio);
		FAudio_PlatformRelease();
	}
	else
	{
		LOG_API_EXIT(audio)
	}
	return refcount;
}